

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type
chaiscript::detail::
Cast_Helper_Inner<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*>
::cast(Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  Type_Info *this;
  Result_Type ppVar2;
  undefined8 uVar3;
  type_info *in_RDI;
  bad_any_cast *unaff_retaddr;
  
  this = Boxed_Value::get_type_info((Boxed_Value *)0x418718);
  bVar1 = Type_Info::is_const(this);
  if (!bVar1) {
    Boxed_Value::get_type_info((Boxed_Value *)0x41872e);
    bVar1 = Type_Info::operator==((Type_Info *)unaff_retaddr,in_RDI);
    if (bVar1) {
      ppVar2 = (Result_Type)Boxed_Value::get_ptr((Boxed_Value *)0x41874d);
      return ppVar2;
    }
  }
  uVar3 = __cxa_allocate_exception(0x28);
  exception::bad_any_cast::bad_any_cast(unaff_retaddr);
  __cxa_throw(uVar3,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (!ob.get_type_info().is_const() && ob.get_type_info() == typeid(Result))
          {
            return static_cast<Result *>(ob.get_ptr());
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }